

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImRect *in_RDI;
  ImVec2 IVar2;
  ImRect IVar3;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImRect r_avoid_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImRect r_avoid;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImRect r_outer;
  ImGuiContext *g;
  ImVec2 pos;
  ImVec2 *in_stack_ffffffffffffff18;
  ImGuiWindow *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  float fVar4;
  undefined4 in_stack_ffffffffffffff34;
  float fVar5;
  ImVec2 in_stack_ffffffffffffff40;
  undefined1 local_74 [16];
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_3c;
  float local_34;
  ImGuiWindow *local_30;
  float policy;
  ImGuiContext *r_avoid_00;
  ImGuiDir *in_stack_fffffffffffffff8;
  
  r_avoid_00 = GImGui;
  IVar3 = GetWindowAllowedExtentRect((ImGuiWindow *)in_stack_ffffffffffffff40);
  policy = IVar3.Max.y;
  if (((uint)(in_RDI->Max).y & 0x10000000) == 0) {
    if (((uint)(in_RDI->Max).y & 0x4000000) == 0) {
      if (((uint)(in_RDI->Max).y & 0x2000000) == 0) {
        IVar2 = in_RDI[1].Min;
      }
      else {
        NavCalcPreferredRefPos();
        ImRect::ImRect((ImRect *)in_stack_ffffffffffffff20);
        fVar4 = (float)((ulong)in_stack_ffffffffffffff20 >> 0x20);
        fVar5 = (float)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        if ((((r_avoid_00->NavDisableHighlight & 1U) == 0) &&
            ((r_avoid_00->NavDisableMouseHover & 1U) != 0)) &&
           (((r_avoid_00->IO).ConfigFlags & 4U) == 0)) {
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         fVar5,(float)in_stack_ffffffffffffff28,fVar4,
                         SUB84(in_stack_ffffffffffffff20,0));
        }
        else {
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         fVar5,(float)in_stack_ffffffffffffff28,fVar4,
                         SUB84(in_stack_ffffffffffffff20,0));
        }
        IVar2 = FindBestWindowPosForPopupEx
                          (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                           (ImRect *)r_avoid_00,(ImGuiPopupPositionPolicy)policy);
        if (in_RDI[10].Min.y == -NAN) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,2.0,2.0);
          IVar2 = operator+(in_stack_ffffffffffffff18,(ImVec2 *)0x12e3ea);
        }
      }
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (float)((ulong)local_74 >> 0x20),SUB84(local_74,0),
                     (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     SUB84(in_stack_ffffffffffffff20,0));
      IVar2 = FindBestWindowPosForPopupEx
                        (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                         (ImRect *)r_avoid_00,(ImGuiPopupPositionPolicy)policy);
    }
  }
  else {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        (&r_avoid_00->CurrentWindowStack,(r_avoid_00->CurrentWindowStack).Size + -2)
    ;
    local_30 = *ppIVar1;
    local_34 = (r_avoid_00->Style).ItemSpacing.x;
    ImRect::ImRect((ImRect *)in_stack_ffffffffffffff20);
    if (((local_30->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                     (float)in_stack_ffffffffffffff28,
                     (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     SUB84(in_stack_ffffffffffffff20,0));
      local_44 = local_64;
      local_3c = local_5c;
    }
    else {
      fVar4 = (local_30->Pos).y;
      ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff20);
      fVar5 = (local_30->Pos).y;
      ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff20);
      ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffff20);
      ImRect::ImRect((ImRect *)CONCAT44(fVar5,fVar4),
                     (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                     (float)in_stack_ffffffffffffff28,
                     (float)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                     SUB84(in_stack_ffffffffffffff20,0));
      local_44 = local_54;
      local_3c = local_4c;
    }
    IVar2 = FindBestWindowPosForPopupEx
                      (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                       (ImRect *)r_avoid_00,(ImGuiPopupPositionPolicy)policy);
  }
  return IVar2;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then our FindBestWindowPosForPopup() function will move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemSpacing.x;       // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}